

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *lang)

{
  bool bVar1;
  pointer ppVar2;
  allocator<char> local_31;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *lang_local;
  cmGlobalGenerator *this_local;
  
  it._M_node = (_Base_ptr)lang;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->LanguageToOutputExtension,lang);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->LanguageToOutputExtension);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  std::string const& lang) const
{
  auto const it = this->LanguageToOutputExtension.find(lang);
  if (it != this->LanguageToOutputExtension.end()) {
    return it->second;
  }
  return "";
}